

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O0

int __thiscall QSqlTableModel::rowCount(QSqlTableModel *this,QModelIndex *parent)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QSqlTableModelPrivate *this_00;
  QSqlTableModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QSqlTableModelPrivate *d;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 local_24;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QSqlTableModel *)0x170bdf);
  bVar2 = QModelIndex::isValid
                    ((QModelIndex *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (bVar2) {
    local_24 = 0;
  }
  else {
    QModelIndex::QModelIndex((QModelIndex *)0x170c08);
    local_24 = QSqlQueryModel::rowCount((QSqlQueryModel *)this_00,(QModelIndex *)in_RDI);
    iVar3 = QSqlTableModelPrivate::insertCount(in_RDI,local_24);
    local_24 = local_24 + iVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_24;
  }
  __stack_chk_fail();
}

Assistant:

int QSqlTableModel::rowCount(const QModelIndex &parent) const
{
    Q_D(const QSqlTableModel);

    if (parent.isValid())
        return 0;

    return QSqlQueryModel::rowCount() + d->insertCount();
}